

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode Curl_cf_https_setup(Curl_easy *data,connectdata *conn,int sockindex,
                            Curl_dns_entry *remotehost)

{
  CURLcode CVar1;
  CURLcode local_30;
  _Bool local_2a;
  bool local_29;
  CURLcode result;
  _Bool try_h21;
  _Bool try_h3;
  Curl_dns_entry *remotehost_local;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_29 = false;
  local_30 = CURLE_OK;
  if (((uint)conn->bits >> 0x19 & 1) != 0) {
    if ((data->state).httpwant == '\x1f') {
      CVar1 = Curl_conn_may_http3(data,conn);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      local_29 = true;
      local_2a = false;
    }
    else {
      if (0x1d < (data->state).httpwant) {
        CVar1 = Curl_conn_may_http3(data,conn);
        local_29 = CVar1 == CURLE_OK;
      }
      local_2a = true;
    }
    local_30 = cf_http_connect_add(data,conn,sockindex,remotehost,local_29,local_2a);
  }
  return local_30;
}

Assistant:

CURLcode Curl_cf_https_setup(struct Curl_easy *data,
                             struct connectdata *conn,
                             int sockindex,
                             const struct Curl_dns_entry *remotehost)
{
  bool try_h3 = FALSE, try_h21 = TRUE; /* defaults, for now */
  CURLcode result = CURLE_OK;

  (void)sockindex;
  (void)remotehost;

  if(!conn->bits.tls_enable_alpn)
    goto out;

  if(data->state.httpwant == CURL_HTTP_VERSION_3ONLY) {
    result = Curl_conn_may_http3(data, conn);
    if(result) /* can't do it */
      goto out;
    try_h3 = TRUE;
    try_h21 = FALSE;
  }
  else if(data->state.httpwant >= CURL_HTTP_VERSION_3) {
    /* We assume that silently not even trying H3 is ok here */
    /* TODO: should we fail instead? */
    try_h3 = (Curl_conn_may_http3(data, conn) == CURLE_OK);
    try_h21 = TRUE;
  }

  result = cf_http_connect_add(data, conn, sockindex, remotehost,
                               try_h3, try_h21);
out:
  return result;
}